

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O3

void __thiscall tinygltf::TinyGLTF::~TinyGLTF(TinyGLTF *this)

{
  URIDecodeFunction *pUVar1;
  _Manager_type p_Var2;
  pointer pcVar3;
  
  p_Var2 = (this->WriteImageData).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->WriteImageData,(_Any_data *)&this->WriteImageData,
              __destroy_functor);
  }
  p_Var2 = (this->LoadImageData).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->LoadImageData,(_Any_data *)&this->LoadImageData,__destroy_functor)
    ;
  }
  p_Var2 = (this->uri_cb).decode.super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    pUVar1 = &(this->uri_cb).decode;
    (*p_Var2)((_Any_data *)pUVar1,(_Any_data *)pUVar1,__destroy_functor);
  }
  p_Var2 = (this->uri_cb).encode.super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->uri_cb,(_Any_data *)&this->uri_cb,__destroy_functor);
  }
  FsCallbacks::~FsCallbacks(&this->fs);
  pcVar3 = (this->err_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->err_).field_2) {
    operator_delete(pcVar3);
  }
  pcVar3 = (this->warn_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->warn_).field_2) {
    operator_delete(pcVar3);
    return;
  }
  return;
}

Assistant:

~TinyGLTF() = default;